

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O0

int bandit::run(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  pointer formatter_00;
  pointer reporter_00;
  pointer policy;
  spec_registry *specs;
  contextstack_t *context_stack;
  type listener;
  unique_ptr<bandit::detail::run_policy,_std::default_delete<bandit::detail::run_policy>_> local_60;
  run_policy_ptr run_policy;
  listener_ptr reporter;
  colorizer colorizer;
  unique_ptr<bandit::detail::failure_formatter,_std::default_delete<bandit::detail::failure_formatter>_>
  local_40;
  failure_formatter_ptr formatter;
  options opt;
  char **argv_local;
  int argc_local;
  
  detail::options::options((options *)&formatter,argc,argv);
  detail::create_formatter((detail *)&local_40,(options *)&formatter);
  bVar1 = detail::options::no_color((options *)&formatter);
  detail::colorizer::colorizer
            ((colorizer *)
             ((long)&reporter._M_t.
                     super___uniq_ptr_impl<bandit::detail::listener,_std::default_delete<bandit::detail::listener>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bandit::detail::listener_*,_std::default_delete<bandit::detail::listener>_>
                     .super__Head_base<0UL,_bandit::detail::listener_*,_false>._M_head_impl + 3),
             (bool)(~bVar1 & 1));
  formatter_00 = std::
                 unique_ptr<bandit::detail::failure_formatter,_std::default_delete<bandit::detail::failure_formatter>_>
                 ::get(&local_40);
  detail::create_reporter
            ((detail *)&run_policy,(options *)&formatter,formatter_00,
             (colorizer *)
             ((long)&reporter._M_t.
                     super___uniq_ptr_impl<bandit::detail::listener,_std::default_delete<bandit::detail::listener>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bandit::detail::listener_*,_std::default_delete<bandit::detail::listener>_>
                     .super__Head_base<0UL,_bandit::detail::listener_*,_false>._M_head_impl + 3));
  reporter_00 = std::
                unique_ptr<bandit::detail::listener,_std::default_delete<bandit::detail::listener>_>
                ::get((unique_ptr<bandit::detail::listener,_std::default_delete<bandit::detail::listener>_>
                       *)&run_policy);
  detail::registered_listener(reporter_00);
  detail::create_run_policy((detail *)&local_60,(options *)&formatter);
  policy = std::
           unique_ptr<bandit::detail::run_policy,_std::default_delete<bandit::detail::run_policy>_>
           ::get(&local_60);
  detail::registered_run_policy(policy);
  specs = detail::specs_abi_cxx11_();
  context_stack = detail::context_stack();
  listener = std::
             unique_ptr<bandit::detail::listener,_std::default_delete<bandit::detail::listener>_>::
             operator*((unique_ptr<bandit::detail::listener,_std::default_delete<bandit::detail::listener>_>
                        *)&run_policy);
  iVar2 = run((options *)&formatter,specs,context_stack,listener);
  std::unique_ptr<bandit::detail::run_policy,_std::default_delete<bandit::detail::run_policy>_>::
  ~unique_ptr(&local_60);
  std::unique_ptr<bandit::detail::listener,_std::default_delete<bandit::detail::listener>_>::
  ~unique_ptr((unique_ptr<bandit::detail::listener,_std::default_delete<bandit::detail::listener>_>
               *)&run_policy);
  std::
  unique_ptr<bandit::detail::failure_formatter,_std::default_delete<bandit::detail::failure_formatter>_>
  ::~unique_ptr(&local_40);
  detail::options::~options((options *)&formatter);
  return iVar2;
}

Assistant:

inline int run(int argc, char* argv[])
  {
    detail::options opt(argc, argv);
    detail::failure_formatter_ptr formatter(create_formatter(opt));
    bandit::detail::colorizer colorizer(!opt.no_color());
    detail::listener_ptr reporter(create_reporter(opt, formatter.get(), colorizer));

    detail::registered_listener(reporter.get());

    detail::run_policy_ptr run_policy = create_run_policy(opt);
    registered_run_policy(run_policy.get());

    return run(opt, detail::specs(), detail::context_stack(), *reporter);
  }